

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.cpp
# Opt level: O1

TestTextureCubeSp __thiscall
vkt::texture::util::loadTextureCube
          (util *this,Archive *archive,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *filenames)

{
  int *piVar1;
  pointer pbVar2;
  pointer pcVar3;
  long *plVar4;
  undefined4 size;
  int iVar5;
  TestTextureCube *pTVar6;
  long *plVar7;
  TestError *pTVar8;
  uint uVar9;
  SharedPtrStateBase *extraout_RDX;
  SharedPtrStateBase *extraout_RDX_00;
  SharedPtrStateBase *extraout_RDX_01;
  SharedPtrStateBase *extraout_RDX_02;
  SharedPtrStateBase *pSVar10;
  SharedPtrStateBase *extraout_RDX_03;
  pointer_____offset_0x10___ *ppuVar11;
  ulong uVar12;
  long lVar13;
  TestTextureCubeSp TVar14;
  CompressedTexture level;
  TextureFormat commonFormat;
  TextureFormat uncompressedFormat;
  vector<unsigned_char,_std::allocator<unsigned_char>_> commonFromatData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> uncompressedData;
  string ext;
  PixelBufferAccess decompressedBuffer;
  PixelBufferAccess commonFormatBuffer;
  undefined1 local_140 [40];
  TextureFormat local_118;
  Archive *local_110;
  long local_108;
  TextureFormat local_100;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e0;
  string local_c8;
  TextureFormat local_a8 [5];
  TexDecompressionParams local_80 [10];
  allocator_type local_58 [40];
  
  pbVar2 = (filenames->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar9 = (int)((ulong)((long)(filenames->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) >> 5) *
          -0x55555555 + 0x2aaaaaaa;
  local_110 = archive;
  if (0x2aaaaaaa < (uVar9 >> 1 | (uint)((uVar9 & 1) != 0) << 0x1f)) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,(char *)0x0,"(int)filenames.size() % tcu::CUBEFACE_LAST == 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
               ,0x6a9);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  pcVar3 = (pbVar2->_M_dataplus)._M_p;
  local_140._0_8_ = (long)local_140 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_140,pcVar3,pcVar3 + pbVar2->_M_string_length);
  de::FilePath::getFileExtension_abi_cxx11_(&local_c8,(FilePath *)local_140);
  if (local_140._0_8_ != (long)local_140 + 0x10) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  iVar5 = std::__cxx11::string::compare((char *)&local_c8);
  if (iVar5 == 0) {
    pSVar10 = extraout_RDX;
    if ((filenames->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish !=
        (filenames->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      lVar13 = 0;
      uVar12 = 0;
      do {
        tcu::TextureLevel::TextureLevel((TextureLevel *)local_140);
        tcu::ImageIO::loadImage
                  ((TextureLevel *)local_140,local_110,
                   *(char **)((long)&(((filenames->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                     _M_p + lVar13));
        size = local_140._8_4_;
        if ((SUB84(local_140._0_8_,4) != UNORM_INT8) || (1 < (ChannelOrder)local_140._0_8_ - RGB)) {
          pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::InternalError::InternalError
                    ((InternalError *)pTVar8,(char *)0x0,
                     "level.getFormat() == tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8) || level.getFormat() == tcu::TextureFormat(tcu::TextureFormat::RGB, tcu::TextureFormat::UNORM_INT8)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                     ,0x6b9);
          ppuVar11 = &tcu::InternalError::typeinfo;
LAB_00824869:
          __cxa_throw(pTVar8,ppuVar11,tcu::Exception::~Exception);
        }
        if (local_140._8_4_ != local_140._12_4_) {
          pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar8,(char *)0x0,"level.getWidth() == level.getHeight()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                     ,0x6bb);
          ppuVar11 = &tcu::TestError::typeinfo;
          goto LAB_00824869;
        }
        if (uVar12 == 0) {
          pTVar6 = (TestTextureCube *)operator_new(0x188);
          local_a8[0].order = RGBA;
          local_a8[0].type = UNORM_INT8;
          vkt::pipeline::TestTextureCube::TestTextureCube(pTVar6,local_a8,size);
          plVar7 = (long *)operator_new(0x20);
          *(undefined4 *)(plVar7 + 1) = 0;
          *(undefined4 *)((long)plVar7 + 0xc) = 0;
          *plVar7 = (long)&PTR__SharedPtrState_00d31b10;
          plVar7[2] = (long)pTVar6;
          *(undefined4 *)(plVar7 + 1) = 1;
          *(undefined4 *)((long)plVar7 + 0xc) = 1;
          plVar4 = *(long **)(this + 8);
          if (plVar4 != plVar7) {
            if (plVar4 != (long *)0x0) {
              LOCK();
              plVar4 = plVar4 + 1;
              *(int *)plVar4 = (int)*plVar4 + -1;
              UNLOCK();
              if ((int)*plVar4 == 0) {
                *(undefined8 *)this = 0;
                (**(code **)(**(long **)(this + 8) + 0x10))();
              }
              LOCK();
              piVar1 = (int *)(*(long *)(this + 8) + 0xc);
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (*piVar1 == 0) {
                if (*(long **)(this + 8) != (long *)0x0) {
                  (**(code **)(**(long **)(this + 8) + 8))();
                }
                *(undefined8 *)(this + 8) = 0;
              }
            }
            *(TestTextureCube **)this = pTVar6;
            *(long **)(this + 8) = plVar7;
            LOCK();
            *(int *)(plVar7 + 1) = (int)plVar7[1] + 1;
            UNLOCK();
            LOCK();
            *(int *)(*(long *)(this + 8) + 0xc) = *(int *)(*(long *)(this + 8) + 0xc) + 1;
            UNLOCK();
          }
          LOCK();
          plVar4 = plVar7 + 1;
          *(int *)plVar4 = (int)*plVar4 + -1;
          UNLOCK();
          if ((int)*plVar4 == 0) {
            (**(code **)(*plVar7 + 0x10))(plVar7);
          }
          LOCK();
          piVar1 = (int *)((long)plVar7 + 0xc);
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            (**(code **)(*plVar7 + 8))(plVar7);
          }
        }
        (**(code **)(**(long **)this + 0x38))
                  (local_a8,*(long **)this,(int)uVar12 / 6,(int)uVar12 % 6);
        tcu::TextureLevel::getAccess((PixelBufferAccess *)local_58,(TextureLevel *)local_140);
        tcu::copy((EVP_PKEY_CTX *)local_a8,(EVP_PKEY_CTX *)local_58);
        tcu::TextureLevel::~TextureLevel((TextureLevel *)local_140);
        uVar12 = uVar12 + 1;
        lVar13 = lVar13 + 0x20;
        pSVar10 = extraout_RDX_02;
      } while (uVar12 < (ulong)((long)(filenames->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(filenames->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 5));
    }
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)&local_c8);
    if (iVar5 != 0) {
      pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar8,"Unsupported file format",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                 ,0x6e0);
      __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    pSVar10 = extraout_RDX_00;
    if ((filenames->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish !=
        (filenames->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      local_108 = 0;
      uVar12 = 0;
      do {
        tcu::CompressedTexture::CompressedTexture((CompressedTexture *)local_140);
        tcu::ImageIO::loadPKM
                  ((CompressedTexture *)local_140,local_110,
                   *(char **)((long)&(((filenames->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                     _M_p + local_108));
        if (local_140._4_4_ != local_140._8_4_) {
          pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar8,(char *)0x0,"level.getWidth() == level.getHeight()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                     ,0x6cc);
          __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        local_100 = tcu::getUncompressedFormat(local_140._0_4_);
        iVar5 = tcu::TextureFormat::getPixelSize(&local_100);
        local_a8[0] = (TextureFormat)((ulong)local_a8[0] & 0xffffffffffffff00);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_e0,(long)(iVar5 * local_140._4_4_ * local_140._8_4_),
                   (value_type_conflict5 *)local_a8,local_58);
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)local_a8,&local_100,local_140._4_4_,local_140._8_4_,1,
                   local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start);
        local_118.order = RGBA;
        local_118.type = UNORM_INT8;
        iVar5 = tcu::TextureFormat::getPixelSize(&local_118);
        local_58[0] = (allocator_type)0x0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_f8,(long)(iVar5 * local_140._4_4_ * local_140._8_4_),
                   (value_type_conflict5 *)local_58,(allocator_type *)local_80);
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)local_58,&local_118,local_140._4_4_,local_140._8_4_,1,
                   local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start);
        if (uVar12 == 0) {
          pTVar6 = (TestTextureCube *)operator_new(0x188);
          vkt::pipeline::TestTextureCube::TestTextureCube(pTVar6,&local_118,local_140._4_4_);
          plVar7 = (long *)operator_new(0x20);
          *(undefined4 *)(plVar7 + 1) = 0;
          *(undefined4 *)((long)plVar7 + 0xc) = 0;
          *plVar7 = (long)&PTR__SharedPtrState_00d31b10;
          plVar7[2] = (long)pTVar6;
          *(undefined4 *)(plVar7 + 1) = 1;
          *(undefined4 *)((long)plVar7 + 0xc) = 1;
          plVar4 = *(long **)(this + 8);
          if (plVar4 != plVar7) {
            if (plVar4 != (long *)0x0) {
              LOCK();
              plVar4 = plVar4 + 1;
              *(int *)plVar4 = (int)*plVar4 + -1;
              UNLOCK();
              if ((int)*plVar4 == 0) {
                *(undefined8 *)this = 0;
                (**(code **)(**(long **)(this + 8) + 0x10))();
              }
              LOCK();
              piVar1 = (int *)(*(long *)(this + 8) + 0xc);
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (*piVar1 == 0) {
                if (*(long **)(this + 8) != (long *)0x0) {
                  (**(code **)(**(long **)(this + 8) + 8))();
                }
                *(undefined8 *)(this + 8) = 0;
              }
            }
            *(TestTextureCube **)this = pTVar6;
            *(long **)(this + 8) = plVar7;
            LOCK();
            *(int *)(plVar7 + 1) = (int)plVar7[1] + 1;
            UNLOCK();
            LOCK();
            *(int *)(*(long *)(this + 8) + 0xc) = *(int *)(*(long *)(this + 8) + 0xc) + 1;
            UNLOCK();
          }
          LOCK();
          plVar4 = plVar7 + 1;
          *(int *)plVar4 = (int)*plVar4 + -1;
          UNLOCK();
          if ((int)*plVar4 == 0) {
            (**(code **)(*plVar7 + 0x10))(plVar7);
          }
          LOCK();
          piVar1 = (int *)((long)plVar7 + 0xc);
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            (**(code **)(*plVar7 + 8))(plVar7);
          }
        }
        local_80[0].astcMode = ASTCMODE_LDR;
        tcu::CompressedTexture::decompress
                  ((CompressedTexture *)local_140,(PixelBufferAccess *)local_a8,local_80);
        tcu::copy((EVP_PKEY_CTX *)local_58,(EVP_PKEY_CTX *)local_a8);
        (**(code **)(**(long **)this + 0x38))
                  ((EVP_PKEY_CTX *)local_80,*(long **)this,(int)uVar12 / 6,(int)uVar12 % 6);
        tcu::copy((EVP_PKEY_CTX *)local_80,(EVP_PKEY_CTX *)local_58);
        if (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_f8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_f8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_e0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_e0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        tcu::CompressedTexture::~CompressedTexture((CompressedTexture *)local_140);
        uVar12 = uVar12 + 1;
        local_108 = local_108 + 0x20;
        pSVar10 = extraout_RDX_01;
      } while (uVar12 < (ulong)((long)(filenames->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(filenames->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 5));
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    pSVar10 = extraout_RDX_03;
  }
  TVar14.m_state = pSVar10;
  TVar14.m_ptr = (TestTextureCube *)this;
  return TVar14;
}

Assistant:

TestTextureCubeSp loadTextureCube (const tcu::Archive& archive, const std::vector<std::string>& filenames)
{
	DE_ASSERT(filenames.size() > 0);
	DE_STATIC_ASSERT(tcu::CUBEFACE_LAST == 6);
	TCU_CHECK((int)filenames.size() % tcu::CUBEFACE_LAST == 0);

	TestTextureCubeSp texture;

	std::string ext = de::FilePath(filenames[0]).getFileExtension();

	if (ext == "png")
	{

		for (size_t fileIndex = 0; fileIndex < filenames.size(); ++fileIndex)
		{
			tcu::TextureLevel level;

			tcu::ImageIO::loadImage(level, archive, filenames[fileIndex].c_str());

			TCU_CHECK_INTERNAL(level.getFormat() == tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8) ||
											   level.getFormat() == tcu::TextureFormat(tcu::TextureFormat::RGB, tcu::TextureFormat::UNORM_INT8));

			TCU_CHECK( level.getWidth() == level.getHeight());

			if (fileIndex == 0)
				texture = TestTextureCubeSp(new pipeline::TestTextureCube(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), level.getWidth()));

			tcu::copy(texture->getLevel((int)fileIndex / 6, (int)fileIndex % 6), level.getAccess());
		}
	}
	else if (ext == "pkm")
	{
		for (size_t fileIndex = 0; fileIndex < filenames.size(); ++fileIndex)
		{
			// Compressed texture.
			tcu::CompressedTexture	level;

			tcu::ImageIO::loadPKM(level, archive, filenames[fileIndex].c_str());

			TCU_CHECK( level.getWidth() == level.getHeight());

			tcu::TextureFormat		uncompressedFormat				= tcu::getUncompressedFormat(level.getFormat());
			std::vector<deUint8>	uncompressedData				(uncompressedFormat.getPixelSize() * level.getWidth() * level.getHeight(), 0);
			tcu::PixelBufferAccess	decompressedBuffer				(uncompressedFormat, level.getWidth(), level.getHeight(), 1, uncompressedData.data());

			tcu::TextureFormat		commonFormat					= tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8);
			std::vector<deUint8>	commonFromatData				(commonFormat.getPixelSize() * level.getWidth() * level.getHeight(), 0);
			tcu::PixelBufferAccess	commonFormatBuffer				(commonFormat, level.getWidth(), level.getHeight(), 1, commonFromatData.data());

			if (fileIndex == 0)
				texture = TestTextureCubeSp(new pipeline::TestTextureCube(commonFormat, level.getWidth()));

			level.decompress(decompressedBuffer, tcu::TexDecompressionParams(tcu::TexDecompressionParams::ASTCMODE_LDR));

			tcu::copy(commonFormatBuffer, decompressedBuffer);
			tcu::copy(texture->getLevel((int)fileIndex / 6, (int)fileIndex % 6), commonFormatBuffer);
		}
	}
	else
		TCU_FAIL("Unsupported file format");

	return texture;
}